

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O1

Array<asl::String> * __thiscall
asl::Map<asl::String,_asl::Array<asl::String>_>::operator[]
          (Map<asl::String,_asl::Array<asl::String>_> *this,String *key)

{
  int *piVar1;
  int n;
  uint k;
  undefined8 __dest;
  anon_union_16_2_78e7fdac_for_String_2 *__src;
  Array<asl::String> local_48;
  KeyVal local_40;
  
  k = indexOf(this,key);
  if ((int)k < 0) {
    Array<asl::String>::alloc(&local_48,0);
    n = key->_len;
    String::alloc(&local_40.key,n);
    __dest = local_40.key.field_2._str;
    if (local_40.key._size == 0) {
      __dest = &local_40.key.field_2;
    }
    k = ~k;
    if (key->_size == 0) {
      __src = &key->field_2;
    }
    else {
      __src = (anon_union_16_2_78e7fdac_for_String_2 *)(key->field_2)._str;
    }
    local_40.key._len = n;
    memcpy((void *)__dest,__src,(long)n + 1);
    local_40.value._a = local_48._a;
    LOCK();
    piVar1 = (int *)((long)&local_48._a[-1].field_2 + 8);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::insert(&this->a,k,&local_40);
    Array<asl::String>::~Array(&local_40.value);
    if (local_40.key._size != 0) {
      free(local_40.key.field_2._str);
    }
    Array<asl::String>::~Array(&local_48);
  }
  return &(this->a)._a[k].value;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}